

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O1

QString * __thiscall
QAccessibleTextWidget::attributes
          (QString *__return_storage_ptr__,QAccessibleTextWidget *this,int offset,int *startOffset,
          int *endOffset)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  MoveMode MVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  QString *pQVar10;
  char *pcVar11;
  storage_type *psVar12;
  QChar QVar13;
  MoveMode MVar14;
  char *pcVar15;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  QLatin1String QVar25;
  QLatin1String QVar26;
  QLatin1String QVar27;
  QBrush foreground;
  QBrush background;
  QTextCursor cursor;
  undefined1 *local_1a0;
  QArrayData *local_198;
  char *local_190;
  QArrayData *local_188 [3];
  QArrayData *local_170 [3];
  QArrayData *local_158;
  char *local_150;
  undefined1 *local_140;
  QArrayData *local_138;
  char16_t *pcStack_130;
  undefined8 local_128;
  QString local_118;
  undefined1 *local_100;
  QString local_f8;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  QTextCharFormat local_b8;
  undefined1 local_a8 [12];
  int iStack_9c;
  undefined1 *local_98;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 local_78 [32];
  QString *local_58;
  char16_t local_50;
  char16_t local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (offset == -2) {
    offset = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0xe8))(this);
  }
  MVar4 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x118))(this);
  MVar14 = offset;
  if (offset == MVar4) {
    MVar14 = MVar4 - KeepAnchor;
  }
  if (offset == ~MoveAnchor) {
    MVar14 = MVar4 - KeepAnchor;
  }
  if ((int)MVar14 < 0 || (int)MVar4 < (int)MVar14) {
    *startOffset = -1;
    *endOffset = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_0052991f;
  }
  local_100 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x158))(&local_100,this);
  QTextCursor::setPosition((int)&local_100,MVar14);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::block();
  iVar5 = QTextBlock::position();
  iVar6 = QTextBlock::length();
  iVar6 = iVar6 + iVar5;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff60 = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::begin();
  iVar8 = iVar5;
  while( true ) {
    if ((int)local_98 == iStack_9c) break;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::iterator::fragment();
    cVar2 = QTextFragment::contains((int)local_78);
    if (cVar2 != '\0') break;
    iVar7 = QTextFragment::position();
    iVar8 = QTextFragment::length();
    iVar8 = iVar8 + iVar7;
    QTextBlock::iterator::operator++((iterator *)local_a8);
  }
  local_b8.super_QTextFormat = (QTextFormat)0xaa;
  local_b8._1_3_ = 0xaaaaaa;
  local_b8._4_4_ = 0xaaaaaaaa;
  local_b8._8_4_ = 0xaaaaaaaa;
  local_b8._12_4_ = 0xaaaaaaaa;
  QTextCharFormat::QTextCharFormat(&local_b8);
  if ((int)local_98 == iStack_9c) {
    QTextBlock::charFormat();
    QTextFormat::operator=(&local_b8.super_QTextFormat,(QTextFormat *)local_78);
    QTextFormat::~QTextFormat((QTextFormat *)local_78);
    *startOffset = iVar8;
    *endOffset = iVar6;
  }
  else {
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::iterator::fragment();
    QTextFragment::charFormat();
    QTextFormat::operator=(&local_b8.super_QTextFormat,(QTextFormat *)&local_f8);
    QTextFormat::~QTextFormat((QTextFormat *)&local_f8);
    iVar8 = QTextFragment::position();
    if (iVar5 < iVar8) {
      iVar5 = iVar8;
    }
    *startOffset = iVar5;
    iVar7 = QTextFragment::length();
    iVar5 = iVar7 + iVar8;
    if (iVar6 <= iVar7 + iVar8) {
      iVar5 = iVar6;
    }
    *endOffset = iVar5;
  }
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::blockFormat();
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::font();
  local_f8.d.d = (Data *)0x0;
  local_f8.d.ptr = (char16_t *)0x0;
  local_f8.d.size = 0;
  local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFont::families();
  if (local_78._16_8_ == 0) {
    local_118.d.d = (Data *)0x0;
    local_118.d.ptr = (char16_t *)0x0;
    local_118.d.size = 0;
  }
  else {
    local_118.d.d = ((DataPointer *)local_78._8_8_)->d;
    local_118.d.ptr = ((DataPointer *)local_78._8_8_)->ptr;
    local_118.d.size = ((DataPointer *)local_78._8_8_)->size;
  }
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_78);
  if (local_118.d.size != 0) {
    QVar22.m_data = (char *)0x2;
    QVar22.m_size = 0x5c;
    QVar13.ucs = (char16_t)&local_118;
    pQVar10 = (QString *)QString::replace(QVar13,QVar22,0x6f8fd2);
    QString::operator=(&local_118,pQVar10);
    QVar23.m_data = (char *)0x2;
    QVar23.m_size = 0x3a;
    pQVar10 = (QString *)QString::replace(QVar13,QVar23,0x6f8fd5);
    QString::operator=(&local_118,pQVar10);
    QVar24.m_data = (char *)0x2;
    QVar24.m_size = 0x2c;
    pQVar10 = (QString *)QString::replace(QVar13,QVar24,0x6f8fd8);
    QString::operator=(&local_118,pQVar10);
    QVar25.m_data = (char *)0x2;
    QVar25.m_size = 0x3d;
    pQVar10 = (QString *)QString::replace(QVar13,QVar25,0x6f8fdb);
    QString::operator=(&local_118,pQVar10);
    QVar26.m_data = (char *)0x2;
    QVar26.m_size = 0x3b;
    pQVar10 = (QString *)QString::replace(QVar13,QVar26,0x6f8fde);
    QString::operator=(&local_118,pQVar10);
    QVar27.m_data = (char *)0x2;
    QVar27.m_size = 0x22;
    pQVar10 = (QString *)QString::replace(QVar13,QVar27,0x6f8fe1);
    QString::operator=(&local_118,pQVar10);
    local_78._24_2_ = 0x22;
    local_50 = L'\"';
    local_78._0_8_ = &DAT_0000000b;
    local_78._8_8_ = "font-family";
    local_78._16_2_ = 0x3a;
    local_48 = L';';
    local_58 = &local_118;
    operator+=(&local_f8,
               (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_char16_t>,_QStringBuilder<QStringBuilder<char16_t,_QString_&>,_char16_t>_>,_char16_t>
                *)local_78);
  }
  iVar5 = QFont::pointSize();
  if (iVar5 != 0) {
    QVar16.m_data = (storage_type *)0x4;
    QVar16.m_size = (qsizetype)&local_138;
    QString::fromLatin1(QVar16);
    QString::arg_impl((longlong)local_78,(int)&local_138,iVar5,(QChar)0x0);
    local_158 = (QArrayData *)&local_f8;
    local_150 = "font-size";
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)&local_158,(QString *)local_78);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    if (local_138 != (QArrayData *)0x0) {
      LOCK();
      (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_138,2,0x10);
      }
    }
  }
  iVar5 = QFont::weight();
  pcVar11 = "bold";
  pcVar15 = "normal";
  if (iVar5 < 0x191) {
    pcVar11 = "normal";
  }
  psVar12 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar1 = psVar12 + (long)(pcVar11 + 1);
    psVar12 = psVar12 + 1;
  } while (*pcVar1 != '\0');
  QVar17.m_data = psVar12;
  QVar17.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar17);
  pcStack_130 = L"font-weight";
  local_138 = (QArrayData *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_138,(QString *)local_78);
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  iVar5 = QFont::style();
  if (iVar5 == 2) {
    pcVar15 = "oblique";
  }
  pcVar11 = "italic";
  if (iVar5 != 1) {
    pcVar11 = pcVar15;
  }
  psVar12 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar15 = psVar12 + (long)(pcVar11 + 1);
    psVar12 = psVar12 + 1;
  } while (*pcVar15 != '\0');
  QVar18.m_data = psVar12;
  QVar18.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar18);
  pcStack_130 = L"font-style";
  local_138 = (QArrayData *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_138,(QString *)local_78);
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  bVar3 = QFont::strikeOut();
  local_78._24_8_ = (ulong)bVar3 * 2 + 4;
  local_58 = (QString *)0x676c44;
  if (bVar3 != 0) {
    local_58 = (QString *)0x6f9031;
  }
  local_78._0_8_ = (QArrayData *)0x16;
  local_78._8_8_ = "text-line-through-type";
  local_78._16_2_ = 0x3a;
  local_50 = L';';
  operator+=(&local_f8,
             (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_char16_t>,_QLatin1String>,_char16_t>
              *)local_78);
  uVar9 = QTextFormat::intProperty((int)&local_b8);
  if (uVar9 == 0) {
    bVar3 = QFont::underline();
    uVar9 = (uint)bVar3;
  }
  local_138 = (QArrayData *)0x0;
  pcStack_130 = (char16_t *)0x0;
  local_128 = 0;
  switch(uVar9) {
  case 0:
    goto switchD_00529139_caseD_0;
  case 1:
    pcStack_130 = L"solid";
    local_128 = 5;
    break;
  case 2:
  case 3:
    pcStack_130 = L"dash";
    goto LAB_00529174;
  case 4:
    pcStack_130 = L"dot-dash";
    local_128 = 8;
    break;
  case 5:
    pcStack_130 = L"dot-dot-dash";
    local_128 = 0xc;
    break;
  case 6:
  case 7:
    pcStack_130 = L"wave";
LAB_00529174:
    local_128 = 4;
    break;
  default:
    attributes();
    goto switchD_00529139_caseD_0;
  }
  local_138 = (QArrayData *)0x0;
switchD_00529139_caseD_0:
  if (pcStack_130 != (char16_t *)0x0) {
    local_78._0_8_ = (Data *)0x14;
    local_78._8_8_ = "text-underline-style";
    local_78._16_2_ = 0x3a;
    local_58 = (QString *)CONCAT62(local_58._2_6_,0x3b);
    local_78._24_8_ = (AttributeFormatterRef *)&local_138;
    operator+=(&local_f8,
               (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_char16_t>,_QString_&>,_char16_t>
                *)local_78);
    local_78._0_8_ = (QArrayData *)0x0;
    local_78._8_8_ = L"single";
    local_78._16_8_ = 6;
    local_150 = "text-underline-type";
    local_158 = (QArrayData *)&local_f8;
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)&local_158,(QString *)local_78);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
  }
  iVar5 = QTextBlock::textDirection();
  if (iVar5 == 1) {
    local_78._0_8_ = (QArrayData *)0x0;
    local_78._8_8_ = L"rl";
    local_78._16_8_ = 2;
    local_150 = "writing-mode";
    local_158 = (QArrayData *)&local_f8;
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)&local_158,(QString *)local_78);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
  }
  iVar5 = QTextFormat::intProperty((int)&local_b8);
  pcVar11 = "baseline";
  if (iVar5 == 1) {
    pcVar11 = "super";
  }
  pcVar15 = "sub";
  if (iVar5 != 2) {
    pcVar15 = pcVar11;
  }
  psVar12 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar11 = psVar12 + (long)(pcVar15 + 1);
    psVar12 = psVar12 + 1;
  } while (*pcVar11 != '\0');
  QVar19.m_data = psVar12;
  QVar19.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar19);
  local_150 = "text-position";
  local_158 = (QArrayData *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_158,(QString *)local_78);
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  local_140 = &DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::brushProperty((int)&local_140);
  if (*(int *)(local_140 + 4) == 1) {
    QVar20.m_data = (storage_type *)0xd;
    QVar20.m_size = (qsizetype)local_188;
    QString::fromLatin1(QVar20);
    iVar5 = QColor::red();
    QString::arg_impl((longlong)local_170,(int)local_188,iVar5,(QChar)0x0);
    iVar5 = QColor::green();
    QString::arg_impl((longlong)&local_158,(int)local_170,iVar5,(QChar)0x0);
    iVar5 = QColor::blue();
    QString::arg_impl((longlong)local_78,(int)&local_158,iVar5,(QChar)0x0);
    local_190 = "background-color";
    local_198 = (QArrayData *)&local_f8;
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)&local_198,(QString *)local_78);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    if (local_158 != (QArrayData *)0x0) {
      LOCK();
      (local_158->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_158->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_158->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_158,2,0x10);
      }
    }
    if (local_170[0] != (QArrayData *)0x0) {
      LOCK();
      (local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_170[0],2,0x10);
      }
    }
    if (local_188[0] != (QArrayData *)0x0) {
      LOCK();
      (local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_188[0],2,0x10);
      }
    }
  }
  local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::brushProperty((int)&local_1a0);
  if (*(int *)(local_1a0 + 4) == 1) {
    QVar21.m_data = (storage_type *)0xd;
    QVar21.m_size = (qsizetype)local_188;
    QString::fromLatin1(QVar21);
    iVar5 = QColor::red();
    QString::arg_impl((longlong)local_170,(int)local_188,iVar5,(QChar)0x0);
    iVar5 = QColor::green();
    QString::arg_impl((longlong)&local_158,(int)local_170,iVar5,(QChar)0x0);
    iVar5 = QColor::blue();
    QString::arg_impl((longlong)local_78,(int)&local_158,iVar5,(QChar)0x0);
    local_190 = "color";
    local_198 = (QArrayData *)&local_f8;
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)&local_198,(QString *)local_78);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    if (local_158 != (QArrayData *)0x0) {
      LOCK();
      (local_158->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_158->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_158->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_158,2,0x10);
      }
    }
    if (local_170[0] != (QArrayData *)0x0) {
      LOCK();
      (local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_170[0],2,0x10);
      }
    }
    if (local_188[0] != (QArrayData *)0x0) {
      LOCK();
      (local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_188[0],2,0x10);
      }
    }
  }
  iVar5 = QTextFormat::intProperty((int)&local_c8);
  switch(iVar5 + (uint)(iVar5 == 0) & 0xf) {
  case 1:
    local_78._8_8_ = L"left";
    local_78._16_8_ = 4;
    break;
  case 2:
    local_78._8_8_ = L"right";
    local_78._16_8_ = 5;
    break;
  default:
    goto switchD_00529685_caseD_3;
  case 4:
    local_78._8_8_ = L"center";
    local_78._16_8_ = 6;
    break;
  case 8:
    local_78._8_8_ = L"justify";
    local_78._16_8_ = 7;
  }
  local_78._0_8_ = (QArrayData *)0x0;
  local_150 = "text-align";
  local_158 = (QArrayData *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_158,(QString *)local_78);
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
switchD_00529685_caseD_3:
  (__return_storage_ptr__->d).d = local_f8.d.d;
  (__return_storage_ptr__->d).ptr = local_f8.d.ptr;
  (__return_storage_ptr__->d).size = local_f8.d.size;
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QBrush::~QBrush((QBrush *)&local_1a0);
  QBrush::~QBrush((QBrush *)&local_140);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,0x10);
    }
  }
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QFont::~QFont((QFont *)&local_d8);
  QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
  QTextFormat::~QTextFormat(&local_b8.super_QTextFormat);
  QTextCursor::~QTextCursor((QTextCursor *)&local_100);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0052991f:
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTextWidget::attributes(int offset, int *startOffset, int *endOffset) const
{
    /* The list of attributes can be found at:
     http://linuxfoundation.org/collaborate/workgroups/accessibility/iaccessible2/textattributes
    */

    // IAccessible2 defines -1 as length and -2 as cursor position
    if (offset == -2)
        offset = cursorPosition();

    const int charCount = characterCount();

    // -1 doesn't make much sense here, but it's better to return something
    // screen readers may ask for text attributes at the cursor pos which may be equal to length
    if (offset == -1 || offset == charCount)
        offset = charCount - 1;

    if (offset < 0 || offset > charCount) {
        *startOffset = -1;
        *endOffset = -1;
        return QString();
    }


    QTextCursor cursor = textCursor();
    cursor.setPosition(offset);
    QTextBlock block = cursor.block();

    int blockStart = block.position();
    int blockEnd = blockStart + block.length();

    QTextBlock::iterator iter = block.begin();
    int lastFragmentIndex = blockStart;
    while (!iter.atEnd()) {
        QTextFragment f = iter.fragment();
        if (f.contains(offset))
            break;
        lastFragmentIndex = f.position() + f.length();
        ++iter;
    }

    QTextCharFormat charFormat;
    if (!iter.atEnd()) {
        QTextFragment fragment = iter.fragment();
        charFormat = fragment.charFormat();
        int pos = fragment.position();
        // text block and fragment may overlap, use the smallest common range
        *startOffset = qMax(pos, blockStart);
        *endOffset = qMin(pos + fragment.length(), blockEnd);
    } else {
        charFormat = block.charFormat();
        *startOffset = lastFragmentIndex;
        *endOffset = blockEnd;
    }
    Q_ASSERT(*startOffset <= offset);
    Q_ASSERT(*endOffset >= offset);

    QTextBlockFormat blockFormat = cursor.blockFormat();

    const QFont charFormatFont = charFormat.font();

    AttributeFormatter attrs;
    QString family = charFormatFont.families().value(0, QString());
    if (!family.isEmpty()) {
        family = family.replace(u'\\', "\\\\"_L1);
        family = family.replace(u':', "\\:"_L1);
        family = family.replace(u',', "\\,"_L1);
        family = family.replace(u'=', "\\="_L1);
        family = family.replace(u';', "\\;"_L1);
        family = family.replace(u'\"', "\\\""_L1);
        attrs["font-family"] = u'"' + family + u'"';
    }

    int fontSize = int(charFormatFont.pointSize());
    if (fontSize)
        attrs["font-size"] = QString::fromLatin1("%1pt").arg(fontSize);

    //Different weight values are not handled
    attrs["font-weight"] = QString::fromLatin1(charFormatFont.weight() > QFont::Normal ? "bold" : "normal");

    QFont::Style style = charFormatFont.style();
    attrs["font-style"] = QString::fromLatin1((style == QFont::StyleItalic) ? "italic" : ((style == QFont::StyleOblique) ? "oblique": "normal"));

    attrs["text-line-through-type"] = charFormatFont.strikeOut() ? "single"_L1 : "none"_L1;

    QTextCharFormat::UnderlineStyle underlineStyle = charFormat.underlineStyle();
    if (underlineStyle == QTextCharFormat::NoUnderline && charFormatFont.underline()) // underline could still be set in the default font
        underlineStyle = QTextCharFormat::SingleUnderline;
    QString underlineStyleValue;
    switch (underlineStyle) {
        case QTextCharFormat::NoUnderline:
            break;
        case QTextCharFormat::SingleUnderline:
            underlineStyleValue = QStringLiteral("solid");
            break;
        case QTextCharFormat::DashUnderline:
            underlineStyleValue = QStringLiteral("dash");
            break;
        case QTextCharFormat::DotLine:
            underlineStyleValue = QStringLiteral("dash");
            break;
        case QTextCharFormat::DashDotLine:
            underlineStyleValue = QStringLiteral("dot-dash");
            break;
        case QTextCharFormat::DashDotDotLine:
            underlineStyleValue = QStringLiteral("dot-dot-dash");
            break;
        case QTextCharFormat::WaveUnderline:
            underlineStyleValue = QStringLiteral("wave");
            break;
        case QTextCharFormat::SpellCheckUnderline:
            underlineStyleValue = QStringLiteral("wave"); // this is not correct, but provides good approximation at least
            break;
        default:
            qWarning() << "Unknown QTextCharFormat::UnderlineStyle value " << underlineStyle << " could not be translated to IAccessible2 value";
            break;
    }
    if (!underlineStyleValue.isNull()) {
        attrs["text-underline-style"] = underlineStyleValue;
        attrs["text-underline-type"] = QStringLiteral("single"); // if underlineStyleValue is set, there is an underline, and Qt does not support other than single ones
    } // else both are "none" which is the default - no need to set them

    if (block.textDirection() == Qt::RightToLeft)
        attrs["writing-mode"] = QStringLiteral("rl");

    QTextCharFormat::VerticalAlignment alignment = charFormat.verticalAlignment();
    attrs["text-position"] = QString::fromLatin1((alignment == QTextCharFormat::AlignSubScript) ? "sub" : ((alignment == QTextCharFormat::AlignSuperScript) ? "super" : "baseline" ));

    QBrush background = charFormat.background();
    if (background.style() == Qt::SolidPattern) {
        attrs["background-color"] = QString::fromLatin1("rgb(%1,%2,%3)").arg(background.color().red()).arg(background.color().green()).arg(background.color().blue());
    }

    QBrush foreground = charFormat.foreground();
    if (foreground.style() == Qt::SolidPattern) {
        attrs["color"] = QString::fromLatin1("rgb(%1,%2,%3)").arg(foreground.color().red()).arg(foreground.color().green()).arg(foreground.color().blue());
    }

    switch (blockFormat.alignment() & (Qt::AlignLeft | Qt::AlignRight | Qt::AlignHCenter | Qt::AlignJustify)) {
    case Qt::AlignLeft:
        attrs["text-align"] = QStringLiteral("left");
        break;
    case Qt::AlignRight:
        attrs["text-align"] = QStringLiteral("right");
        break;
    case Qt::AlignHCenter:
        attrs["text-align"] = QStringLiteral("center");
        break;
    case Qt::AlignJustify:
        attrs["text-align"] = QStringLiteral("justify");
        break;
    }

    return attrs.toFormatted();
}